

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodedata ** Node_GetDataStart(node *Node,dataid Id,datatype Type)

{
  nodedata *local_38;
  nodedata **i;
  uint_fast32_t Code;
  datatype Type_local;
  dataid Id_local;
  node *Node_local;
  
  local_38 = (nodedata *)&Node->Data;
  while( true ) {
    if (local_38->Next == (nodedata *)0x0) {
      return (nodedata **)0x0;
    }
    if (local_38->Next->Code == (Id << 8 | Type)) break;
    local_38 = local_38->Next;
  }
  return &local_38->Next;
}

Assistant:

NOINLINE nodedata** Node_GetDataStart(node* Node, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata** i;

    for (i=&Node->Data;*i;i=&(*i)->Next)
        if ((*i)->Code == Code)
        {
            return i;
        }

    return NULL;
}